

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O2

int pk_parse_key_sec1_der(mbedtls_ecp_keypair *eck,uchar *key,size_t keylen)

{
  mbedtls_mpi *X;
  byte bVar1;
  int iVar2;
  uchar *end;
  uchar *puVar3;
  uchar *p;
  size_t len;
  int version;
  mbedtls_asn1_buf params;
  
  p = key;
  iVar2 = mbedtls_asn1_get_tag(&p,key + keylen,&len,0x30);
  if (iVar2 != 0) goto LAB_00135a6d;
  puVar3 = p + len;
  iVar2 = mbedtls_asn1_get_int(&p,puVar3,&version);
  if (iVar2 != 0) goto LAB_00135a6d;
  if (version != 1) {
    return -0x3d80;
  }
  iVar2 = mbedtls_asn1_get_tag(&p,puVar3,&len,4);
  if (iVar2 != 0) goto LAB_00135a6d;
  X = &eck->d;
  iVar2 = mbedtls_mpi_read_binary(X,p,len);
  if (iVar2 == 0) {
    p = p + len;
    if ((p != puVar3) && (iVar2 = mbedtls_asn1_get_tag(&p,puVar3,&len,0xa0), iVar2 != -0x62)) {
      if (iVar2 != 0) goto LAB_00135ac3;
      if ((long)len < 1) {
        iVar2 = -0x3d60;
        goto LAB_00135c50;
      }
      bVar1 = *p;
      params.tag = (int)bVar1;
      if ((params.tag != 0x30) && (iVar2 = -0x3d62, bVar1 != 6)) goto LAB_00135c50;
      end = p + len;
      iVar2 = mbedtls_asn1_get_tag(&p,end,&params.len,(uint)bVar1);
      if (iVar2 == 0) {
        params.p = p;
        p = p + params.len;
        iVar2 = -0x3d66;
        if (p != end) goto LAB_00135c50;
      }
      else {
        iVar2 = iVar2 + -0x3d00;
        if (iVar2 != 0) goto LAB_00135c50;
      }
      iVar2 = pk_use_ecparams(&params,&eck->grp);
      if (iVar2 != 0) goto LAB_00135c50;
    }
    if ((p == puVar3) || (iVar2 = mbedtls_asn1_get_tag(&p,puVar3,&len,0xa1), iVar2 == -0x62)) {
LAB_00135c1b:
      iVar2 = mbedtls_ecp_mul(&eck->grp,&eck->Q,X,&(eck->grp).G,
                              (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0);
      if (iVar2 == 0) {
LAB_00135c3f:
        iVar2 = mbedtls_ecp_check_privkey(&eck->grp,X);
        if (iVar2 == 0) {
          return 0;
        }
LAB_00135c50:
        mbedtls_ecp_keypair_free(eck);
        return iVar2;
      }
    }
    else if (iVar2 == 0) {
      puVar3 = p + len;
      iVar2 = mbedtls_asn1_get_bitstring_null(&p,puVar3,&len);
      if (iVar2 != 0) goto LAB_00135a6d;
      if (p + len != puVar3) {
        return -0x3d66;
      }
      iVar2 = pk_get_ecpubkey(&p,puVar3,eck);
      if (iVar2 == -0x4e80) goto LAB_00135c1b;
      if (iVar2 != 0) {
        return -0x3d00;
      }
      goto LAB_00135c3f;
    }
  }
LAB_00135ac3:
  mbedtls_ecp_keypair_free(eck);
LAB_00135a6d:
  return iVar2 + -0x3d00;
}

Assistant:

static int pk_parse_key_sec1_der( mbedtls_ecp_keypair *eck,
                                  const unsigned char *key,
                                  size_t keylen )
{
    int ret;
    int version, pubkey_done;
    size_t len;
    mbedtls_asn1_buf params;
    unsigned char *p = (unsigned char *) key;
    unsigned char *end = p + keylen;
    unsigned char *end2;

    /*
     * RFC 5915, or SEC1 Appendix C.4
     *
     * ECPrivateKey ::= SEQUENCE {
     *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
     *      privateKey     OCTET STRING,
     *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
     *      publicKey  [1] BIT STRING OPTIONAL
     *    }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_int( &p, end, &version ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( version != 1 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_VERSION );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( ( ret = mbedtls_mpi_read_binary( &eck->d, p, len ) ) != 0 )
    {
        mbedtls_ecp_keypair_free( eck );
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    p += len;

    pubkey_done = 0;
    if( p != end )
    {
        /*
         * Is 'parameters' present?
         */
        if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) ) == 0 )
        {
            if( ( ret = pk_get_ecparams( &p, p + len, &params) ) != 0 ||
                ( ret = pk_use_ecparams( &params, &eck->grp )  ) != 0 )
            {
                mbedtls_ecp_keypair_free( eck );
                return( ret );
            }
        }
        else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        {
            mbedtls_ecp_keypair_free( eck );
            return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
        }
    }

    if( p != end )
    {
        /*
         * Is 'publickey' present? If not, or if we can't read it (eg because it
         * is compressed), create it from the private key.
         */
        if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) ) == 0 )
        {
            end2 = p + len;

            if( ( ret = mbedtls_asn1_get_bitstring_null( &p, end2, &len ) ) != 0 )
                return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

            if( p + len != end2 )
                return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
                        MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

            if( ( ret = pk_get_ecpubkey( &p, end2, eck ) ) == 0 )
                pubkey_done = 1;
            else
            {
                /*
                 * The only acceptable failure mode of pk_get_ecpubkey() above
                 * is if the point format is not recognized.
                 */
                if( ret != MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE )
                    return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
            }
        }
        else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        {
            mbedtls_ecp_keypair_free( eck );
            return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
        }
    }

    if( ! pubkey_done &&
        ( ret = mbedtls_ecp_mul( &eck->grp, &eck->Q, &eck->d, &eck->grp.G,
                                                      NULL, NULL ) ) != 0 )
    {
        mbedtls_ecp_keypair_free( eck );
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    if( ( ret = mbedtls_ecp_check_privkey( &eck->grp, &eck->d ) ) != 0 )
    {
        mbedtls_ecp_keypair_free( eck );
        return( ret );
    }

    return( 0 );
}